

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O0

int __thiscall piksel::Font::load(Font *this,string *filename)

{
  int iVar1;
  char *__filename;
  FILE *__stream;
  size_t __size;
  uchar *fontBuffer_00;
  FILE *fontFile;
  uchar *fontBuffer;
  long size;
  string *filename_local;
  Font *this_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"rb");
  fseek(__stream,0,2);
  __size = ftell(__stream);
  fseek(__stream,0,0);
  fontBuffer_00 = (uchar *)malloc(__size);
  fread(fontBuffer_00,__size,1,__stream);
  fclose(__stream);
  iVar1 = _load(this,fontBuffer_00);
  return iVar1;
}

Assistant:

int Font::load(std::string filename) {
    long size;
    unsigned char* fontBuffer;
    FILE* fontFile = fopen(filename.c_str(), "rb");
    fseek(fontFile, 0, SEEK_END);
    size = ftell(fontFile);
    fseek(fontFile, 0, SEEK_SET);
    fontBuffer = (unsigned char *) malloc(size);
    fread(fontBuffer, size, 1, fontFile);
    fclose(fontFile);
    return _load(fontBuffer);
}